

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

RepeatedField<unsigned_long> * __thiscall
google::protobuf::Reflection::GetRawSplit<google::protobuf::RepeatedField<unsigned_long>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  long lVar1;
  char *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  RepeatedField<unsigned_long> *pRVar5;
  string_view str;
  string_view v;
  LogMessage local_50 [2];
  
  VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
  this_00 = &this->schema_;
  bVar3 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar3) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6eb,"!schema_.InRealOneof(field)");
    str._M_str = "Field = ";
    str._M_len = 8;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(local_50,str);
    pcVar2 = (field->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(local_50,v);
    if (bVar3) goto LAB_0026ce6b;
  }
  if ((this->schema_).split_offset_ != -1) {
    uVar4 = internal::ReflectionSchema::SplitOffset(this_00);
    lVar1 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
    uVar4 = internal::ReflectionSchema::GetFieldOffsetNonOneof(this_00,field);
    bVar3 = internal::
            SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<unsigned_long>>
                      (field);
    pRVar5 = (RepeatedField<unsigned_long> *)((ulong)uVar4 + lVar1);
    if (bVar3) {
      pRVar5 = (RepeatedField<unsigned_long> *)(pRVar5->soo_rep_).field_0.long_rep.elements_int;
    }
    return pRVar5;
  }
  GetRawSplit<google::protobuf::RepeatedField<unsigned_long>>();
LAB_0026ce6b:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_50);
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}